

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

BOOL js_is_live_code(JSParseState *s)

{
  byte bVar1;
  uint uVar2;
  
  if ((long)*(int *)&s[2].buf_end < 0) {
    return 1;
  }
  bVar1 = *(byte *)(s[2].token.u.str.str.tag + (long)*(int *)&s[2].buf_end);
  uVar2 = (uint)bVar1;
  if (bVar1 < 0x6b) {
    if (0x30 < uVar2) {
      return 1;
    }
    if ((0x1c32800000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      return 1;
    }
  }
  else if (((1 < bVar1 - 0xea) && (bVar1 != 0x6b)) && (uVar2 != 0x6e)) {
    return 1;
  }
  return 0;
}

Assistant:

static BOOL js_is_live_code(JSParseState *s) {
    switch (get_prev_opcode(s->cur_func)) {
    case OP_tail_call:
    case OP_tail_call_method:
    case OP_return:
    case OP_return_undef:
    case OP_return_async:
    case OP_throw:
    case OP_throw_error:
    case OP_goto:
#if SHORT_OPCODES
    case OP_goto8:
    case OP_goto16:
#endif
    case OP_ret:
        return FALSE;
    default:
        return TRUE;
    }
}